

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdVerifyTxSign(void *handle,int net_type,char *tx_hex,char *txid,uint32_t vout,char *address,
                   int address_type,char *direct_locking_script,int64_t value_satoshi,
                   char *value_bytedata)

{
  initializer_list<cfd::UtxoData> __l;
  bool bVar1;
  undefined8 uVar2;
  char *in_RCX;
  char *in_RDX;
  uint32_t in_R8D;
  char *in_R9;
  char *in_stack_00000010;
  int64_t in_stack_00000018;
  char *in_stack_00000020;
  CfdException *except;
  exception *std_except;
  ConfidentialTransactionContext tx_1;
  TransactionContext tx;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ElementsConfidentialAddress confidential_addr;
  ElementsAddressFactory address_factory_1;
  AddressFactory address_factory;
  string addr;
  UtxoData utxo;
  bool is_bitcoin;
  OutPoint outpoint;
  Amount amount;
  AddressType addr_type;
  int result;
  UtxoData *in_stack_ffffffffffffea28;
  UtxoData *in_stack_ffffffffffffea30;
  AddressFactory *in_stack_ffffffffffffea38;
  string *in_stack_ffffffffffffea40;
  CfdError in_stack_ffffffffffffea4c;
  CfdException *in_stack_ffffffffffffea50;
  allocator_type *in_stack_ffffffffffffea58;
  allocator *paVar3;
  ElementsAddressFactory *in_stack_ffffffffffffea60;
  iterator in_stack_ffffffffffffea68;
  ConfidentialTransactionContext *in_stack_ffffffffffffea70;
  bool *in_stack_ffffffffffffea88;
  UtxoData *in_stack_ffffffffffffea90;
  UtxoData *in_stack_ffffffffffffea98;
  UtxoData *in_stack_ffffffffffffeaa0;
  undefined8 ****ppppuVar4;
  undefined8 ****local_1558;
  string local_14b9;
  ConfidentialValue local_1498;
  allocator local_1469;
  string local_1468 [223];
  allocator local_1389;
  string local_1388 [224];
  undefined1 ****local_12a8;
  undefined8 ***local_12a0 [77];
  OutPoint *in_stack_ffffffffffffefc8;
  ConfidentialTransactionContext *in_stack_ffffffffffffefd0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_fffffffffffff0d8;
  ConfidentialTransactionContext *in_stack_fffffffffffff0e0;
  undefined1 ****local_db0;
  undefined8 local_da8;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_da0;
  allocator local_d81;
  string local_d80;
  Script local_d60;
  Script local_d28;
  Address local_cf0;
  OutPoint *in_stack_fffffffffffff5f8;
  TransactionContext *in_stack_fffffffffffff600;
  Address local_828;
  allocator local_681;
  string local_680;
  Txid local_660;
  undefined8 local_640;
  Txid local_618;
  uint32_t local_5f8;
  Script local_5f0 [2];
  Address local_580;
  string local_408 [32];
  int64_t local_3e8;
  undefined1 local_3e0;
  AddressType local_3d8;
  undefined8 local_3d0;
  ConfidentialValue local_1b0 [2];
  byte local_14a;
  allocator local_149;
  string local_148;
  Txid local_128;
  OutPoint local_108;
  Amount local_e0;
  AddressType local_d0;
  undefined1 local_ca;
  allocator local_c9;
  string local_c8 [32];
  CfdSourceLocation local_a8;
  undefined1 local_8a;
  allocator local_89;
  string local_88 [32];
  CfdSourceLocation local_68;
  undefined4 local_3c;
  char *local_38;
  uint32_t local_2c;
  char *local_28;
  char *local_20;
  int local_4;
  
  local_3c = 0xffffffff;
  local_38 = in_R9;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_20 = in_RDX;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    local_68.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_68.filename = local_68.filename + 1;
    local_68.line = 0x8a8;
    local_68.funcname = "CfdVerifyTxSign";
    cfd::core::logger::warn<>(&local_68,"tx is null or empty.");
    local_8a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"Failed to parameter. tx is null or empty.",&local_89);
    cfd::core::CfdException::CfdException
              (in_stack_ffffffffffffea50,in_stack_ffffffffffffea4c,in_stack_ffffffffffffea40);
    local_8a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (bVar1) {
    local_a8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_transaction.cpp"
                 ,0x2f);
    local_a8.filename = local_a8.filename + 1;
    local_a8.line = 0x8ae;
    local_a8.funcname = "CfdVerifyTxSign";
    cfd::core::logger::warn<>(&local_a8,"txid is null or empty.");
    local_ca = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"Failed to parameter. txid is null or empty.",&local_c9);
    cfd::core::CfdException::CfdException
              (in_stack_ffffffffffffea50,in_stack_ffffffffffffea4c,in_stack_ffffffffffffea40);
    local_ca = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_d0 = cfd::capi::ConvertAddressType((int)((ulong)in_stack_ffffffffffffea90 >> 0x20));
  cfd::core::Amount::Amount(&local_e0,in_stack_00000018);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,local_28,&local_149);
  cfd::core::Txid::Txid(&local_128,&local_148);
  cfd::core::OutPoint::OutPoint(&local_108,&local_128,local_2c);
  cfd::core::Txid::~Txid((Txid *)0x61d55a);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  local_14a = 0;
  cfd::capi::ConvertNetType
            ((int)((ulong)in_stack_ffffffffffffea90 >> 0x20),in_stack_ffffffffffffea88);
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffea90);
  local_3d8 = 1;
  local_640 = 0;
  local_3d0 = 0;
  std::__cxx11::string::operator=(local_408,"");
  cfd::core::OutPoint::GetTxid(&local_660,&local_108);
  cfd::core::Txid::operator=(&local_618,&local_660);
  cfd::core::Txid::~Txid((Txid *)0x61d615);
  local_5f8 = cfd::core::OutPoint::GetVout(&local_108);
  local_3d8 = local_d0;
  local_3e0 = local_e0.ignore_check_;
  local_3e8 = local_e0.amount_;
  bVar1 = cfd::capi::IsEmptyString(local_38);
  if (bVar1) {
    bVar1 = cfd::capi::IsEmptyString(in_stack_00000010);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_d80,in_stack_00000010,&local_d81);
      cfd::core::Script::Script(&local_d60,&local_d80);
      cfd::core::Script::operator=(local_5f0,&local_d60);
      cfd::core::Script::~Script((Script *)in_stack_ffffffffffffea30);
      std::__cxx11::string::~string((string *)&local_d80);
      std::allocator<char>::~allocator((allocator<char> *)&local_d81);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_680,local_38,&local_681);
    std::allocator<char>::~allocator((allocator<char> *)&local_681);
    if ((local_14a & 1) == 0) {
      cfd::ElementsAddressFactory::ElementsAddressFactory(in_stack_ffffffffffffea60);
      bVar1 = cfd::core::ElementsConfidentialAddress::IsConfidentialAddress(&local_680);
      if (bVar1) {
        cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
                  ((ElementsConfidentialAddress *)&stack0xfffffffffffff600,&local_680);
        cfd::core::ElementsConfidentialAddress::GetUnblindedAddress
                  ((Address *)&stack0xfffffffffffff488,
                   (ElementsConfidentialAddress *)&stack0xfffffffffffff600);
        cfd::core::Address::operator=(&local_580,(Address *)&stack0xfffffffffffff488);
        cfd::core::Address::~Address((Address *)in_stack_ffffffffffffea30);
        cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                  ((ElementsConfidentialAddress *)in_stack_ffffffffffffea30);
      }
      else {
        cfd::AddressFactory::GetAddress
                  (in_stack_ffffffffffffea38,(string *)in_stack_ffffffffffffea30);
        cfd::core::Address::operator=(&local_580,&local_cf0);
        cfd::core::Address::~Address((Address *)in_stack_ffffffffffffea30);
      }
      cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x61da08);
    }
    else {
      cfd::AddressFactory::AddressFactory((AddressFactory *)0x61d6f8);
      cfd::AddressFactory::GetAddress(in_stack_ffffffffffffea38,(string *)in_stack_ffffffffffffea30)
      ;
      cfd::core::Address::operator=(&local_580,&local_828);
      cfd::core::Address::~Address((Address *)in_stack_ffffffffffffea30);
      cfd::AddressFactory::~AddressFactory((AddressFactory *)0x61d74a);
    }
    cfd::core::Address::GetLockingScript(&local_d28,&local_580);
    cfd::core::Script::operator=(local_5f0,&local_d28);
    cfd::core::Script::~Script((Script *)in_stack_ffffffffffffea30);
    std::__cxx11::string::~string((string *)&local_680);
  }
  local_12a8 = (undefined1 ****)local_12a0;
  cfd::UtxoData::UtxoData(in_stack_ffffffffffffeaa0,in_stack_ffffffffffffea98);
  local_db0 = (undefined1 ****)local_12a0;
  local_da8 = 1;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x61dc19);
  __l._M_len = (size_type)in_stack_ffffffffffffea70;
  __l._M_array = in_stack_ffffffffffffea68;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffea60,__l,
             in_stack_ffffffffffffea58);
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x61dc4d);
  ppppuVar4 = local_12a0;
  local_1558 = &local_db0;
  do {
    local_1558 = local_1558 + -0x9e;
    cfd::UtxoData::~UtxoData(in_stack_ffffffffffffea30);
  } while (local_1558 != ppppuVar4);
  if ((local_14a & 1) == 0) {
    paVar3 = &local_1469;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1468,local_20,paVar3);
    cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)in_stack_ffffffffffffea30,
               (string *)in_stack_ffffffffffffea28);
    std::__cxx11::string::~string(local_1468);
    std::allocator<char>::~allocator((allocator<char> *)&local_1469);
    bVar1 = cfd::capi::IsEmptyString(in_stack_00000020);
    if (!bVar1) {
      in_stack_ffffffffffffea40 = &local_14b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_14b9.field_0x1,in_stack_00000020,
                 (allocator *)in_stack_ffffffffffffea40);
      cfd::core::ConfidentialValue::ConfidentialValue(&local_1498,(string *)&local_14b9.field_0x1);
      cfd::core::ConfidentialValue::operator=(local_1b0,&local_1498);
      cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x61dfa5);
      std::__cxx11::string::~string((string *)&local_14b9.field_0x1);
      std::allocator<char>::~allocator((allocator<char> *)&local_14b9);
      std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[](&local_da0,0);
      cfd::UtxoData::operator=(in_stack_ffffffffffffea30,in_stack_ffffffffffffea28);
    }
    cfd::ConfidentialTransactionContext::GetTxInIndex
              (in_stack_ffffffffffffea70,(OutPoint *)in_stack_ffffffffffffea68);
    cfd::ConfidentialTransactionContext::CollectInputUtxo
              (in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
    local_3c = 7;
    cfd::ConfidentialTransactionContext::Verify(in_stack_ffffffffffffefd0,in_stack_ffffffffffffefc8)
    ;
    cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
              ((ConfidentialTransactionContext *)in_stack_ffffffffffffea30);
  }
  else {
    paVar3 = &local_1389;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1388,local_20,paVar3);
    cfd::TransactionContext::TransactionContext
              ((TransactionContext *)in_stack_ffffffffffffea30,(string *)in_stack_ffffffffffffea28);
    std::__cxx11::string::~string(local_1388);
    std::allocator<char>::~allocator((allocator<char> *)&local_1389);
    cfd::TransactionContext::GetTxInIndex
              ((TransactionContext *)in_stack_ffffffffffffea70,(OutPoint *)in_stack_ffffffffffffea68
              );
    cfd::TransactionContext::CollectInputUtxo
              ((TransactionContext *)in_stack_fffffffffffff0e0,in_stack_fffffffffffff0d8);
    local_3c = 7;
    cfd::TransactionContext::Verify(in_stack_fffffffffffff600,in_stack_fffffffffffff5f8);
    cfd::TransactionContext::~TransactionContext((TransactionContext *)in_stack_ffffffffffffea30);
  }
  local_4 = 0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffea40);
  cfd::UtxoData::~UtxoData(in_stack_ffffffffffffea30);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x61e152);
  return local_4;
}

Assistant:

int CfdVerifyTxSign(
    void* handle, int net_type, const char* tx_hex, const char* txid,
    uint32_t vout, const char* address, int address_type,
    const char* direct_locking_script, int64_t value_satoshi,
    const char* value_bytedata) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }

    AddressType addr_type = ConvertAddressType(address_type);
    Amount amount = Amount(value_satoshi);
    OutPoint outpoint(Txid(txid), vout);

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);

    UtxoData utxo;
    utxo.address_type = AddressType::kP2shAddress;
    utxo.block_height = 0;
    utxo.binary_data = nullptr;
    utxo.descriptor = "";
    utxo.txid = outpoint.GetTxid();
    utxo.vout = outpoint.GetVout();
    utxo.address_type = addr_type;
    utxo.amount = amount;
    if (!IsEmptyString(address)) {
      std::string addr(address);
      if (is_bitcoin) {
        AddressFactory address_factory;
        utxo.address = address_factory.GetAddress(addr);
      } else {
#ifndef CFD_DISABLE_ELEMENTS
        ElementsAddressFactory address_factory;
        if (ElementsConfidentialAddress::IsConfidentialAddress(addr)) {
          ElementsConfidentialAddress confidential_addr(addr);
          utxo.address = confidential_addr.GetUnblindedAddress();
        } else {
          utxo.address = address_factory.GetAddress(addr);
        }
#else
        throw CfdException(
            CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
      }
      utxo.locking_script = utxo.address.GetLockingScript();
    } else if (!IsEmptyString(direct_locking_script)) {
      utxo.locking_script = Script(direct_locking_script);
    }
    std::vector<UtxoData> utxos = {utxo};

    if (is_bitcoin) {
      TransactionContext tx(tx_hex);
      tx.GetTxInIndex(outpoint);
      tx.CollectInputUtxo(utxos);
      result = CfdErrorCode::kCfdSignVerificationError;
      tx.Verify(outpoint);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex);
      if (!IsEmptyString(value_bytedata)) {
        utxo.value_commitment = ConfidentialValue(value_bytedata);
        utxos[0] = utxo;
      }
      tx.GetTxInIndex(outpoint);
      tx.CollectInputUtxo(utxos);
      result = CfdErrorCode::kCfdSignVerificationError;
      tx.Verify(outpoint);
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    if (result != CfdErrorCode::kCfdSignVerificationError) {
      result = SetLastError(handle, except);
    } else {
      SetLastError(handle, except);  // collect error message
    }
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}